

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_self_test(int verbose)

{
  int iVar1;
  ulong uStack_c0;
  int ret;
  size_t i;
  uchar ciphertext [32];
  uchar plaintext [24];
  undefined1 local_78 [8];
  mbedtls_ccm_context ctx;
  int verbose_local;
  
  ctx.cipher_ctx.cmac_ctx._0_4_ = verbose;
  mbedtls_ccm_init((mbedtls_ccm_context *)local_78);
  iVar1 = mbedtls_ccm_setkey((mbedtls_ccm_context *)local_78,MBEDTLS_CIPHER_ID_AES,
                             "@ABCDEFGHIJKLMNO",0x80);
  if (iVar1 == 0) {
    for (uStack_c0 = 0; uStack_c0 < 3; uStack_c0 = uStack_c0 + 1) {
      if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
        printf("  CCM-AES #%u: ");
      }
      memset(ciphertext + 0x18,0,0x18);
      memset(&i,0,0x20);
      memcpy(ciphertext + 0x18," !\"#$%&\'()*+,-./01234567",msg_len_test_data[uStack_c0]);
      iVar1 = mbedtls_ccm_encrypt_and_tag
                        ((mbedtls_ccm_context *)local_78,msg_len_test_data[uStack_c0],
                         "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",
                         iv_len_test_data[uStack_c0],"",add_len_test_data[uStack_c0],
                         ciphertext + 0x18,(uchar *)&i,
                         ciphertext + (msg_len_test_data[uStack_c0] - 8),
                         tag_len_test_data[uStack_c0]);
      if ((iVar1 != 0) ||
         (iVar1 = memcmp(&i,res_test_data + uStack_c0,
                         msg_len_test_data[uStack_c0] + tag_len_test_data[uStack_c0]), iVar1 != 0))
      {
        if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
          printf("failed\n");
        }
        return 1;
      }
      memset(ciphertext + 0x18,0,0x18);
      iVar1 = mbedtls_ccm_auth_decrypt
                        ((mbedtls_ccm_context *)local_78,msg_len_test_data[uStack_c0],
                         "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b",
                         iv_len_test_data[uStack_c0],"",add_len_test_data[uStack_c0],(uchar *)&i,
                         ciphertext + 0x18,ciphertext + (msg_len_test_data[uStack_c0] - 8),
                         tag_len_test_data[uStack_c0]);
      if ((iVar1 != 0) ||
         (iVar1 = memcmp(ciphertext + 0x18," !\"#$%&\'()*+,-./01234567",msg_len_test_data[uStack_c0]
                        ), iVar1 != 0)) {
        if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
          printf("failed\n");
        }
        return 1;
      }
      if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
        printf("passed\n");
      }
    }
    mbedtls_ccm_free((mbedtls_ccm_context *)local_78);
    if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
      printf("\n");
    }
    ctx.cipher_ctx.cmac_ctx._4_4_ = 0;
  }
  else {
    if ((int)ctx.cipher_ctx.cmac_ctx != 0) {
      printf("  CCM: setup failed");
    }
    ctx.cipher_ctx.cmac_ctx._4_4_ = 1;
  }
  return ctx.cipher_ctx.cmac_ctx._4_4_;
}

Assistant:

int mbedtls_ccm_self_test( int verbose )
{
    mbedtls_ccm_context ctx;
    /*
     * Some hardware accelerators require the input and output buffers
     * would be in RAM, because the flash is not accessible.
     * Use buffers on the stack to hold the test vectors data.
     */
    unsigned char plaintext[CCM_SELFTEST_PT_MAX_LEN];
    unsigned char ciphertext[CCM_SELFTEST_CT_MAX_LEN];
    size_t i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_ccm_init( &ctx );

    if( mbedtls_ccm_setkey( &ctx, MBEDTLS_CIPHER_ID_AES, key_test_data,
                            8 * sizeof key_test_data ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM: setup failed" );

        return( 1 );
    }

    for( i = 0; i < NB_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  CCM-AES #%u: ", (unsigned int) i + 1 );

        memset( plaintext, 0, CCM_SELFTEST_PT_MAX_LEN );
        memset( ciphertext, 0, CCM_SELFTEST_CT_MAX_LEN );
        memcpy( plaintext, msg_test_data, msg_len_test_data[i] );

        ret = mbedtls_ccm_encrypt_and_tag( &ctx, msg_len_test_data[i],
                                           iv_test_data, iv_len_test_data[i],
                                           ad_test_data, add_len_test_data[i],
                                           plaintext, ciphertext,
                                           ciphertext + msg_len_test_data[i],
                                           tag_len_test_data[i] );

        if( ret != 0 ||
            memcmp( ciphertext, res_test_data[i],
                    msg_len_test_data[i] + tag_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
        memset( plaintext, 0, CCM_SELFTEST_PT_MAX_LEN );

        ret = mbedtls_ccm_auth_decrypt( &ctx, msg_len_test_data[i],
                                        iv_test_data, iv_len_test_data[i],
                                        ad_test_data, add_len_test_data[i],
                                        ciphertext, plaintext,
                                        ciphertext + msg_len_test_data[i],
                                        tag_len_test_data[i] );

        if( ret != 0 ||
            memcmp( plaintext, msg_test_data, msg_len_test_data[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    mbedtls_ccm_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}